

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestExtends::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  short sVar1;
  CallContext<capnproto_test::capnp::test::TestExtends::QuxParams,_capnproto_test::capnp::test::TestExtends::QuxResults>
  CVar2;
  CallContext<capnproto_test::capnp::test::TestAllTypes,_capnproto_test::capnp::test::TestExtends::CorgeResults>
  CVar3;
  CallContext<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  CVar4;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined6 in_register_00000032;
  long *plVar6;
  DispatchCallResult DVar7;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar5;
  
  plVar6 = (long *)CONCAT62(in_register_00000032,methodId);
  sVar1 = (short)context.hook;
  if (sVar1 == 0) {
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestExtends::QuxParams,capnproto_test::capnp::test::TestExtends::QuxResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x40))(this,plVar6,CVar2.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar5 = extraout_RDX;
  }
  else if (sVar1 == 1) {
    CVar3 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestAllTypes,capnproto_test::capnp::test::TestExtends::CorgeResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x48))(this,plVar6,CVar3.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar5 = extraout_RDX_00;
  }
  else if (sVar1 == 2) {
    CVar4 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestExtends::GraultParams,capnproto_test::capnp::test::TestAllTypes>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x50))(this,plVar6,CVar4.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar5 = extraout_RDX_01;
  }
  else {
    DVar7 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),0x491bcc,
                       0xb748);
    uVar5 = DVar7._8_8_;
  }
  DVar7.isStreaming = (bool)(char)uVar5;
  DVar7.allowCancellation = (bool)(char)((ulong)uVar5 >> 8);
  DVar7._10_6_ = (int6)((ulong)uVar5 >> 0x10);
  DVar7.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar7;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestExtends::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        qux(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestExtends::QuxParams,  ::capnproto_test::capnp::test::TestExtends::QuxResults>(context)),
        false,
        false
      };
    case 1:
      return {
        corge(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestAllTypes,  ::capnproto_test::capnp::test::TestExtends::CorgeResults>(context)),
        false,
        false
      };
    case 2:
      return {
        grault(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestExtends::GraultParams,  ::capnproto_test::capnp::test::TestAllTypes>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestExtends",
          0xe4e9bac98670b748ull, methodId);
  }
}